

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall UIContext::Detail::ActivateContext(Detail *this)

{
  ImGuiContext *pIVar1;
  long in_RDI;
  ImGuiContext *prevContext;
  
  pIVar1 = ImGui::GetCurrentContext();
  if (pIVar1 != *(ImGuiContext **)(in_RDI + 8)) {
    if (pIVar1 != (ImGuiContext *)0x0) {
      memcpy((void *)(*(long *)(in_RDI + 8) + 0x1550),&pIVar1->Style,0x3a0);
      memcpy((void *)(*(long *)(in_RDI + 8) + 0x3c),(pIVar1->IO).KeyMap,0x54);
      *(char **)(*(long *)(in_RDI + 8) + 0x20) = (pIVar1->IO).IniFilename;
      *(_func_void_ImDrawData_ptr **)(*(long *)(in_RDI + 8) + 0x128) =
           (pIVar1->IO).RenderDrawListsFn;
      **(byte **)(in_RDI + 8) = pIVar1->Initialized & 1;
    }
    ImGui::SetCurrentContext(*(ImGuiContext **)(in_RDI + 8));
  }
  return;
}

Assistant:

void ActivateContext()
    {
        ImGuiContext* prevContext = ImGui::GetCurrentContext();
        if (prevContext == _context)
            return;

        if (prevContext != nullptr)
        {
            std::memcpy(&_context->Style, &prevContext->Style, sizeof(ImGuiStyle));
            std::memcpy(&_context->IO.KeyMap, &prevContext->IO.KeyMap, sizeof(prevContext->IO.KeyMap));
            //std::memcpy(&_context->MouseCursorData, &prevContext->MouseCursorData, sizeof(_context->MouseCursorData));
            _context->IO.IniFilename = prevContext->IO.IniFilename;
            _context->IO.RenderDrawListsFn = prevContext->IO.RenderDrawListsFn;
            _context->Initialized = prevContext->Initialized;
        }

        ImGui::SetCurrentContext(_context);
    }